

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O2

LY_ERR lyd_parse_xml(ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,
                    ly_in *in,uint32_t parse_opts,uint32_t val_opts,uint32_t int_opts,ly_set *parsed
                    ,ly_bool *subtree_sibling,lyd_ctx **lydctx_p)

{
  anon_struct_24_3_37108ca1 **xmlctx_p;
  lyxml_ctx *xmlctx;
  bool bVar1;
  bool bVar2;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lyd_ctx *lydctx;
  ly_err_item *plVar5;
  lyd_node **op;
  bool bVar6;
  uint32_t local_68;
  lyd_node *act;
  lyd_node **local_40;
  LYXML_PARSER_STATUS status;
  
  act = (lyd_node *)0x0;
  local_40 = first_p;
  if (((ctx == (ly_ctx *)0x0) || (in == (ly_in *)0x0)) || (lydctx_p == (lyd_ctx **)0x0)) {
    __assert_fail("ctx && in && lydctx_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x4e4,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if ((short)parse_opts != 0) {
    __assert_fail("!(parse_opts & ~LYD_PARSE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x4e5,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if (0xffff < val_opts) {
    __assert_fail("!(val_opts & ~LYD_VALIDATE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x4e6,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  lydctx = (lyd_ctx *)calloc(1,0x1080);
  if (lydctx == (lyd_ctx *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_parse_xml");
    return LY_EMEM;
  }
  xmlctx_p = &lydctx->data_ctx;
  LVar3 = lyxml_ctx_new(ctx,in,(lyxml_ctx **)xmlctx_p);
  if (LVar3 != LY_SUCCESS) goto LAB_0012e36c;
  lydctx->parse_opts = parse_opts;
  lydctx->val_opts = val_opts;
  lydctx->int_opts = int_opts;
  lydctx->free = lyd_xml_ctx_free;
  lydctx->ext = ext;
  op = &lydctx->op_node;
  LVar3 = lyd_parser_find_operation(parent,int_opts,op);
  if (LVar3 != LY_SUCCESS) goto LAB_0012e36c;
  if ((~int_opts & 3) == 0) {
    LVar3 = lydxml_envelope((lyxml_ctx *)*xmlctx_p,"action","urn:ietf:params:xml:ns:yang:1",'\0',
                            &act);
    bVar6 = LVar3 != LY_SUCCESS;
    local_68 = int_opts;
    if (!bVar6) {
      local_68 = int_opts & 0xfffffffe;
    }
  }
  else {
    bVar6 = true;
    local_68 = int_opts;
  }
  LVar4 = LY_SUCCESS;
  bVar2 = false;
  do {
    bVar1 = bVar2;
    LVar3 = LVar4;
    if (*(int *)&(*xmlctx_p)->in != 0) break;
    LVar3 = lydxml_subtree_r((lyd_xml_ctx *)lydctx,parent,local_40,parsed);
    if (LVar3 != LY_SUCCESS) {
      plVar5 = ly_err_last((*xmlctx_p)->ctx);
      if (LVar3 != LY_EVALID) goto LAB_0012e36c;
      if ((lydctx->val_opts & 4) == 0) goto LAB_0012e59c;
      LVar3 = LY_EVALID;
      LVar4 = LY_EVALID;
      if (plVar5->vecode == LYVE_SYNTAX) goto LAB_0012e36c;
    }
    LVar3 = LVar4;
    bVar1 = true;
    LVar4 = LVar3;
    bVar2 = true;
  } while ((local_68 & 0x20) != 0);
  if (bVar6) {
LAB_0012e4dc:
    if (((local_68 & 0x40) != 0) && (*(int *)&(*xmlctx_p)->in == 0)) {
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected sibling node.");
      plVar5 = ly_err_last(lydctx->data_ctx->ctx);
      if ((lydctx->val_opts & 4) == 0) goto LAB_0012e59c;
      LVar3 = LY_EVALID;
      if (plVar5->vecode == LYVE_SYNTAX) goto LAB_0012e36c;
    }
    if (((local_68 & 0xf) != 0) && (*op == (lyd_node *)0x0)) {
      ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Missing the operation node.");
      plVar5 = ly_err_last(lydctx->data_ctx->ctx);
      LVar3 = LY_EVALID;
      if (((lydctx->val_opts & 4) == 0) || (plVar5->vecode == LYVE_SYNTAX)) goto LAB_0012e36c;
    }
    if (!bVar1) {
      *op = (lyd_node *)0x0;
    }
    if ((parse_opts >> 0x16 & 1) != 0) {
      if (subtree_sibling == (ly_bool *)0x0) {
        __assert_fail("subtree_sibling",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x529,
                      "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                     );
      }
      LVar4 = lyxml_ctx_peek((lyxml_ctx *)*xmlctx_p,&status);
      if (LVar4 == LY_SUCCESS && status == LYXML_ELEMENT) {
        *subtree_sibling = '\x01';
      }
      else {
        *subtree_sibling = '\0';
      }
    }
  }
  else {
    xmlctx = (lyxml_ctx *)*xmlctx_p;
    if (xmlctx->status != LYXML_ELEMENT) {
      if (xmlctx->status != LYXML_ELEM_CLOSE) {
        __assert_fail("lydctx->xmlctx->status == LYXML_ELEMENT",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x50c,
                      "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                     );
      }
      LVar3 = lyxml_ctx_next(xmlctx);
      if (LVar3 != LY_SUCCESS) goto LAB_0012e36c;
      LVar3 = LY_SUCCESS;
      goto LAB_0012e4dc;
    }
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected child element \"%.*s\".",
            (ulong)*(uint *)&xmlctx->field_6,(xmlctx->field_5).name);
LAB_0012e59c:
    LVar3 = LY_EVALID;
  }
LAB_0012e36c:
  if (((parse_opts >> 0x10 & 1) != 0) &&
     ((((lydctx->node_types).count != 0 || ((lydctx->meta_types).count != 0)) ||
      ((lydctx->node_when).count != 0)))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || (!lydctx->node_types.count && !lydctx->meta_types.count && !lydctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x534,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  lyd_free_tree(act);
  if ((LVar3 == LY_SUCCESS) || (((lydctx->val_opts & 4) != 0 && (LVar3 == LY_EVALID)))) {
    *lydctx_p = lydctx;
    lyxml_ctx_free((lyxml_ctx *)lydctx->data_ctx);
    lydctx->data_ctx = (anon_struct_24_3_37108ca1 *)0x0;
  }
  else {
    lyd_xml_ctx_free(lydctx);
  }
  return LVar3;
}

Assistant:

LY_ERR
lyd_parse_xml(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, uint32_t int_opts,
        struct ly_set *parsed, ly_bool *subtree_sibling, struct lyd_ctx **lydctx_p)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_xml_ctx *lydctx;
    ly_bool parsed_data_nodes = 0, close_elem = 0;
    struct lyd_node *act = NULL;
    enum LYXML_PARSER_STATUS status;

    assert(ctx && in && lydctx_p);
    assert(!(parse_opts & ~LYD_PARSE_OPTS_MASK));
    assert(!(val_opts & ~LYD_VALIDATE_OPTS_MASK));

    /* init context */
    lydctx = calloc(1, sizeof *lydctx);
    LY_CHECK_ERR_RET(!lydctx, LOGMEM(ctx), LY_EMEM);
    LY_CHECK_GOTO(rc = lyxml_ctx_new(ctx, in, &lydctx->xmlctx), cleanup);
    lydctx->parse_opts = parse_opts;
    lydctx->val_opts = val_opts;
    lydctx->int_opts = int_opts;
    lydctx->free = lyd_xml_ctx_free;
    lydctx->ext = ext;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lydctx->op_node), cleanup);

    if ((int_opts & LYD_INTOPT_RPC) && (int_opts & LYD_INTOPT_ACTION)) {
        /* can be either, try to parse "action" */
        if (!lydxml_envelope(lydctx->xmlctx, "action", "urn:ietf:params:xml:ns:yang:1", 0, &act)) {
            close_elem = 1;
            int_opts &= ~LYD_INTOPT_RPC;
        }
    }

    /* parse XML data */
    while (lydctx->xmlctx->status == LYXML_ELEMENT) {
        r = lydxml_subtree_r(lydctx, parent, first_p, parsed);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

        parsed_data_nodes = 1;

        if (!(int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    }

    /* close an opened element */
    if (close_elem) {
        if (lydctx->xmlctx->status != LYXML_ELEM_CLOSE) {
            assert(lydctx->xmlctx->status == LYXML_ELEMENT);
            LOGVAL(lydctx->xmlctx->ctx, LYVE_SYNTAX, "Unexpected child element \"%.*s\".",
                    (int)lydctx->xmlctx->name_len, lydctx->xmlctx->name);
            rc = LY_EVALID;
            goto cleanup;
        }

        LY_CHECK_GOTO(rc = lyxml_ctx_next(lydctx->xmlctx), cleanup);
    }

    /* check final state */
    if ((int_opts & LYD_INTOPT_NO_SIBLINGS) && (lydctx->xmlctx->status == LYXML_ELEMENT)) {
        LOGVAL(ctx, LYVE_SYNTAX, "Unexpected sibling node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }
    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lydctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }

    if (!parsed_data_nodes) {
        /* no data nodes were parsed */
        lydctx->op_node = NULL;
    }

    if (parse_opts & LYD_PARSE_SUBTREE) {
        /* check for a sibling element */
        assert(subtree_sibling);
        if (!lyxml_ctx_peek(lydctx->xmlctx, &status) && (status == LYXML_ELEMENT)) {
            *subtree_sibling = 1;
        } else {
            *subtree_sibling = 0;
        }
    }

cleanup:
    /* there should be no unres stored if validation should be skipped */
    assert(!(parse_opts & LYD_PARSE_ONLY) || (!lydctx->node_types.count && !lydctx->meta_types.count &&
            !lydctx->node_when.count));

    lyd_free_tree(act);
    if (rc && (!(lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) || (rc != LY_EVALID))) {
        lyd_xml_ctx_free((struct lyd_ctx *)lydctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lydctx;

        /* the XML context is no more needed, freeing it also stops logging line numbers which would be confusing now */
        lyxml_ctx_free(lydctx->xmlctx);
        lydctx->xmlctx = NULL;
    }
    return rc;
}